

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int conv_num(char **buf,int *dest,int llim,int ulim)

{
  char *pcVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int rulim;
  int result;
  int ulim_local;
  int llim_local;
  int *dest_local;
  char **buf_local;
  
  local_2c = 0;
  if ((**buf < '0') || (local_30 = ulim, '9' < **buf)) {
    buf_local._4_4_ = 0;
  }
  else {
    do {
      pcVar1 = *buf;
      *buf = pcVar1 + 1;
      local_2c = *pcVar1 + -0x30 + local_2c * 10;
      local_30 = local_30 / 10;
      bVar2 = false;
      if (((local_2c * 10 <= ulim) && (bVar2 = false, local_30 != 0)) &&
         (bVar2 = false, '/' < **buf)) {
        bVar2 = **buf < ':';
      }
    } while (bVar2);
    if ((local_2c < llim) || (ulim < local_2c)) {
      buf_local._4_4_ = 0;
    }
    else {
      *dest = local_2c;
      buf_local._4_4_ = 1;
    }
  }
  return buf_local._4_4_;
}

Assistant:

static int conv_num(const char * *buf, int * dest, int llim, int ulim) {
	int result = 0;

	/* The limit also determines the number of valid digits. */
	int rulim = ulim;

	if (**buf < '0' || ** buf > '9') {
		return (0);
	}

	do {
		result *= 10;
		result += *(*buf)++ - '0';
		rulim /= 10;
	} while ((result * 10 <= ulim) && rulim && ** buf >= '0' && ** buf <= '9');

	if (result < llim || result > ulim) {
		return (0);
	}

	*dest = result;
	return (1);
}